

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChLoaderUVW.h
# Opt level: O2

void __thiscall
chrono::ChLoaderUVWdistributed::ComputeQ
          (ChLoaderUVWdistributed *this,ChVectorDynamic<> *state_x,ChVectorDynamic<> *state_w)

{
  ChVectorDynamic<> *this_00;
  element_type *peVar1;
  pointer pvVar2;
  pointer pvVar3;
  pointer pvVar4;
  _func_int *p_Var5;
  pointer pvVar6;
  char cVar7;
  int iVar8;
  int iVar9;
  int iVar10;
  int iVar11;
  ChQuadratureTablesTetrahedron *pCVar12;
  ChQuadratureTablesTriangle *pCVar13;
  ChQuadratureTables *pCVar14;
  long lVar15;
  uint uVar16;
  ulong uVar17;
  ulong uVar18;
  uint uVar19;
  char *__assertion;
  uint uVar20;
  ulong uVar21;
  double detJ;
  pointer local_98;
  ChLoaderUVWdistributed *local_90;
  ChVectorDynamic<> *local_88;
  ChVectorDynamic<> *local_80;
  ChVectorDynamic<> mNF;
  double local_68;
  pointer local_60;
  MatrixBase<Eigen::Matrix<double,_1,1,0,_1,1>> *local_58;
  ChVectorDynamic<> mF;
  
  peVar1 = (this->super_ChLoaderUVW).loadable.
           super___shared_ptr<chrono::ChLoadableUVW,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  this_00 = &(this->super_ChLoaderUVW).super_ChLoader.Q;
  local_88 = state_x;
  local_80 = state_w;
  iVar8 = (**(code **)(*(long *)((long)&peVar1->field_0x0 + *(long *)((long)*peVar1 + -0x78)) + 0x18
                      ))((long)&peVar1->field_0x0 + *(long *)((long)*peVar1 + -0x78));
  local_58 = (MatrixBase<Eigen::Matrix<double,_1,1,0,_1,1>> *)this_00;
  Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::setZero
            (&this_00->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,(long)iVar8);
  peVar1 = (this->super_ChLoaderUVW).loadable.
           super___shared_ptr<chrono::ChLoadableUVW,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  mNF.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data._0_4_ =
       (**(code **)(*(long *)((long)&peVar1->field_0x0 + *(long *)((long)*peVar1 + -0x78)) + 0x38))
                 ((long)&peVar1->field_0x0 + *(long *)((long)*peVar1 + -0x78));
  Eigen::Matrix<double,_-1,_1,_0,_-1,_1>::Matrix<int>
            ((Matrix<double,__1,_1,_0,__1,_1> *)&mF,(int *)&mNF);
  Eigen::DenseBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::setZero
            ((DenseBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)&mF);
  cVar7 = (**(code **)((long)*(this->super_ChLoaderUVW).loadable.
                              super___shared_ptr<chrono::ChLoadableUVW,_(__gnu_cxx::_Lock_policy)2>.
                              _M_ptr + 0x78))();
  local_90 = this;
  if (cVar7 == '\0') {
    cVar7 = (**(code **)((long)*(this->super_ChLoaderUVW).loadable.
                                super___shared_ptr<chrono::ChLoadableUVW,_(__gnu_cxx::_Lock_policy)2>
                                ._M_ptr + 0x80))();
    p_Var5 = (this->super_ChLoaderUVW).super_ChLoader._vptr_ChLoader[6];
    if (cVar7 == '\0') {
      iVar8 = (*p_Var5)(this);
      pCVar14 = ChQuadrature::GetStaticTables();
      lVar15 = (long)(pCVar14->Lroots).
                     super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_finish -
               (long)(pCVar14->Lroots).
                     super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start;
      if ((ulong)(lVar15 / 0x18) < (ulong)(long)iVar8) {
        __assertion = "GetIntegrationPointsU() <= ChQuadrature::GetStaticTables()->Lroots.size()";
        uVar19 = 0x76;
      }
      else {
        iVar8 = (*(this->super_ChLoaderUVW).super_ChLoader._vptr_ChLoader[7])
                          (this,(long)iVar8,lVar15 % 0x18);
        pCVar14 = ChQuadrature::GetStaticTables();
        lVar15 = (long)(pCVar14->Lroots).
                       super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_finish -
                 (long)(pCVar14->Lroots).
                       super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start;
        if ((ulong)(lVar15 / 0x18) < (ulong)(long)iVar8) {
          __assertion = "GetIntegrationPointsV() <= ChQuadrature::GetStaticTables()->Lroots.size()";
          uVar19 = 0x77;
        }
        else {
          iVar8 = (*(this->super_ChLoaderUVW).super_ChLoader._vptr_ChLoader[8])
                            (this,(long)iVar8,lVar15 % 0x18);
          pCVar14 = ChQuadrature::GetStaticTables();
          if ((ulong)(long)iVar8 <=
              (ulong)(((long)(pCVar14->Lroots).
                             super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_finish -
                      (long)(pCVar14->Lroots).
                            super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_start) / 0x18)) {
            pCVar14 = ChQuadrature::GetStaticTables();
            iVar8 = (*(this->super_ChLoaderUVW).super_ChLoader._vptr_ChLoader[6])(this);
            local_98 = (pCVar14->Lroots).
                       super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start + iVar8;
            pCVar14 = ChQuadrature::GetStaticTables();
            iVar8 = (*(this->super_ChLoaderUVW).super_ChLoader._vptr_ChLoader[6])(this);
            local_60 = (pCVar14->Weight).
                       super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start + iVar8;
            pCVar14 = ChQuadrature::GetStaticTables();
            iVar8 = (*(this->super_ChLoaderUVW).super_ChLoader._vptr_ChLoader[7])(this);
            pvVar2 = (pCVar14->Lroots).
                     super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start;
            pCVar14 = ChQuadrature::GetStaticTables();
            iVar9 = (*(this->super_ChLoaderUVW).super_ChLoader._vptr_ChLoader[7])(this);
            pvVar3 = (pCVar14->Weight).
                     super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start;
            pCVar14 = ChQuadrature::GetStaticTables();
            iVar10 = (*(this->super_ChLoaderUVW).super_ChLoader._vptr_ChLoader[8])(this);
            pvVar4 = (pCVar14->Lroots).
                     super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start;
            pCVar14 = ChQuadrature::GetStaticTables();
            iVar11 = (*(this->super_ChLoaderUVW).super_ChLoader._vptr_ChLoader[8])(this);
            detJ = (double)(this->super_ChLoaderUVW).super_ChLoader.Q.
                           super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
                           m_rows;
            pvVar6 = (pCVar14->Weight).
                     super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start;
            Eigen::Matrix<double,_-1,_1,_0,_-1,_1>::Matrix<long>(&mNF,(long *)&detJ);
            for (uVar19 = 0; uVar18 = (ulong)uVar19,
                uVar18 < (ulong)((long)local_98[-1].
                                       super__Vector_base<double,_std::allocator<double>_>._M_impl.
                                       super__Vector_impl_data._M_finish -
                                 *(long *)&local_98[-1].
                                           super__Vector_base<double,_std::allocator<double>_>.
                                           _M_impl.super__Vector_impl_data >> 3);
                uVar19 = uVar19 + 1) {
              for (uVar16 = 0; uVar17 = (ulong)uVar16,
                  uVar17 < (ulong)((long)pvVar2[(long)iVar8 + -1].
                                         super__Vector_base<double,_std::allocator<double>_>._M_impl
                                         .super__Vector_impl_data._M_finish -
                                   *(long *)&pvVar2[(long)iVar8 + -1].
                                             super__Vector_base<double,_std::allocator<double>_>.
                                             _M_impl.super__Vector_impl_data >> 3);
                  uVar16 = uVar16 + 1) {
                uVar20 = 0;
                while( true ) {
                  lVar15 = *(long *)&pvVar4[(long)iVar10 + -1].
                                     super__Vector_base<double,_std::allocator<double>_>._M_impl.
                                     super__Vector_impl_data;
                  uVar21 = (ulong)uVar20;
                  if ((ulong)((long)pvVar4[(long)iVar10 + -1].
                                    super__Vector_base<double,_std::allocator<double>_>._M_impl.
                                    super__Vector_impl_data._M_finish - lVar15 >> 3) <= uVar21)
                  break;
                  (*(local_90->super_ChLoaderUVW).super_ChLoader._vptr_ChLoader[5])
                            (*(undefined8 *)
                              (*(long *)&local_98[-1].
                                         super__Vector_base<double,_std::allocator<double>_>._M_impl
                                         .super__Vector_impl_data + uVar18 * 8),
                             *(undefined8 *)
                              (*(long *)&pvVar2[(long)iVar8 + -1].
                                         super__Vector_base<double,_std::allocator<double>_>._M_impl
                                         .super__Vector_impl_data + uVar17 * 8),
                             *(undefined8 *)(lVar15 + uVar21 * 8),local_90,&mF,local_88,local_80);
                  peVar1 = (local_90->super_ChLoaderUVW).loadable.
                           super___shared_ptr<chrono::ChLoadableUVW,_(__gnu_cxx::_Lock_policy)2>.
                           _M_ptr;
                  (**(code **)((long)*peVar1 + 0x68))
                            (*(undefined8 *)
                              (*(long *)&local_98[-1].
                                         super__Vector_base<double,_std::allocator<double>_>._M_impl
                                         .super__Vector_impl_data + uVar18 * 8),
                             *(undefined8 *)
                              (*(long *)&pvVar2[(long)iVar8 + -1].
                                         super__Vector_base<double,_std::allocator<double>_>._M_impl
                                         .super__Vector_impl_data + uVar17 * 8),
                             *(undefined8 *)
                              (*(long *)&pvVar4[(long)iVar10 + -1].
                                         super__Vector_base<double,_std::allocator<double>_>._M_impl
                                         .super__Vector_impl_data + uVar21 * 8),peVar1,
                             (DenseBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)&mNF,&detJ,&mF,
                             local_88,local_80);
                  local_68 = detJ * *(double *)
                                     (*(long *)&local_60[-1].
                                                super__Vector_base<double,_std::allocator<double>_>.
                                                _M_impl + uVar18 * 8) *
                             *(double *)
                              (*(long *)&pvVar3[(long)iVar9 + -1].
                                         super__Vector_base<double,_std::allocator<double>_>._M_impl
                              + uVar17 * 8) *
                             *(double *)
                              (*(long *)&pvVar6[(long)iVar11 + -1].
                                         super__Vector_base<double,_std::allocator<double>_>._M_impl
                              + uVar21 * 8);
                  Eigen::DenseBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::operator*=
                            ((DenseBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)&mNF,&local_68);
                  Eigen::MatrixBase<Eigen::Matrix<double,-1,1,0,-1,1>>::operator+=
                            (local_58,(MatrixBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)&mNF);
                  uVar20 = uVar20 + 1;
                }
              }
            }
            goto LAB_00bbc3e8;
          }
          __assertion = "GetIntegrationPointsW() <= ChQuadrature::GetStaticTables()->Lroots.size()";
          uVar19 = 0x78;
        }
      }
    }
    else {
      iVar8 = (*p_Var5)(this);
      pCVar13 = ChQuadrature::GetStaticTablesTriangle();
      if ((ulong)(((long)(pCVar13->Weight).
                         super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_finish -
                  (long)(pCVar13->Weight).
                        super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_start) / 0x18) < (ulong)(long)iVar8) {
        __assertion = 
        "GetIntegrationPointsU() <= ChQuadrature::GetStaticTablesTriangle()->Weight.size()";
        uVar19 = 0x5a;
      }
      else {
        pCVar13 = ChQuadrature::GetStaticTablesTriangle();
        iVar8 = (*(this->super_ChLoaderUVW).super_ChLoader._vptr_ChLoader[6])(this);
        pvVar2 = (pCVar13->LrootsU).
                 super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        pCVar13 = ChQuadrature::GetStaticTablesTriangle();
        iVar9 = (*(this->super_ChLoaderUVW).super_ChLoader._vptr_ChLoader[6])(this);
        pvVar3 = (pCVar13->LrootsV).
                 super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        pCVar13 = ChQuadrature::GetStaticTablesTriangle();
        iVar10 = (*(this->super_ChLoaderUVW).super_ChLoader._vptr_ChLoader[6])(this);
        local_98 = (pCVar13->Weight).
                   super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start + iVar10;
        iVar10 = (*(this->super_ChLoaderUVW).super_ChLoader._vptr_ChLoader[8])(this);
        pCVar14 = ChQuadrature::GetStaticTables();
        if ((ulong)(long)iVar10 <=
            (ulong)(((long)(pCVar14->Lroots).
                           super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_finish -
                    (long)(pCVar14->Lroots).
                          super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_start) / 0x18)) {
          pCVar14 = ChQuadrature::GetStaticTables();
          iVar10 = (*(this->super_ChLoaderUVW).super_ChLoader._vptr_ChLoader[8])(this);
          pvVar4 = (pCVar14->Lroots).
                   super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start;
          pCVar14 = ChQuadrature::GetStaticTables();
          iVar11 = (*(this->super_ChLoaderUVW).super_ChLoader._vptr_ChLoader[8])(this);
          detJ = (double)(this->super_ChLoaderUVW).super_ChLoader.Q.
                         super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
                         m_rows;
          local_60 = (pCVar14->Weight).
                     super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start + iVar11;
          Eigen::Matrix<double,_-1,_1,_0,_-1,_1>::Matrix<long>(&mNF,(long *)&detJ);
          for (uVar19 = 0; uVar18 = (ulong)uVar19,
              uVar18 < (ulong)((long)pvVar2[(long)iVar8 + -1].
                                     super__Vector_base<double,_std::allocator<double>_>._M_impl.
                                     super__Vector_impl_data._M_finish -
                               *(long *)&pvVar2[(long)iVar8 + -1].
                                         super__Vector_base<double,_std::allocator<double>_>._M_impl
                                         .super__Vector_impl_data >> 3); uVar19 = uVar19 + 1) {
            for (uVar16 = 0; uVar17 = (ulong)uVar16,
                uVar17 < (ulong)((long)pvVar4[(long)iVar10 + -1].
                                       super__Vector_base<double,_std::allocator<double>_>._M_impl.
                                       super__Vector_impl_data._M_finish -
                                 *(long *)&pvVar4[(long)iVar10 + -1].
                                           super__Vector_base<double,_std::allocator<double>_>.
                                           _M_impl.super__Vector_impl_data >> 3);
                uVar16 = uVar16 + 1) {
              lVar15 = *(long *)&pvVar3[(long)iVar9 + -1].
                                 super__Vector_base<double,_std::allocator<double>_>._M_impl.
                                 super__Vector_impl_data;
              (*(local_90->super_ChLoaderUVW).super_ChLoader._vptr_ChLoader[5])
                        (*(undefined8 *)
                          (*(long *)&pvVar2[(long)iVar8 + -1].
                                     super__Vector_base<double,_std::allocator<double>_>._M_impl.
                                     super__Vector_impl_data + uVar18 * 8),
                         *(undefined8 *)(lVar15 + uVar18 * 8),*(undefined8 *)(lVar15 + uVar17 * 8),
                         local_90,&mF,local_88,local_80);
              lVar15 = *(long *)&pvVar3[(long)iVar9 + -1].
                                 super__Vector_base<double,_std::allocator<double>_>._M_impl.
                                 super__Vector_impl_data;
              peVar1 = (local_90->super_ChLoaderUVW).loadable.
                       super___shared_ptr<chrono::ChLoadableUVW,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
              (**(code **)((long)*peVar1 + 0x68))
                        (*(undefined8 *)
                          (*(long *)&pvVar2[(long)iVar8 + -1].
                                     super__Vector_base<double,_std::allocator<double>_>._M_impl.
                                     super__Vector_impl_data + uVar18 * 8),
                         *(undefined8 *)(lVar15 + uVar18 * 8),*(undefined8 *)(lVar15 + uVar17 * 8),
                         peVar1,(DenseBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)&mNF,&detJ,&mF
                         ,local_88,local_80);
              local_68 = detJ * *(double *)
                                 (*(long *)&local_98[-1].
                                            super__Vector_base<double,_std::allocator<double>_>.
                                            _M_impl.super__Vector_impl_data + uVar18 * 8) *
                         *(double *)
                          (*(long *)&local_60[-1].
                                     super__Vector_base<double,_std::allocator<double>_>._M_impl +
                          uVar17 * 8) * 0.5;
              Eigen::DenseBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::operator*=
                        ((DenseBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)&mNF,&local_68);
              Eigen::MatrixBase<Eigen::Matrix<double,-1,1,0,-1,1>>::operator+=
                        (local_58,(MatrixBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)&mNF);
            }
          }
          goto LAB_00bbc3e8;
        }
        __assertion = "GetIntegrationPointsW() <= ChQuadrature::GetStaticTables()->Lroots.size()";
        uVar19 = 0x5e;
      }
    }
  }
  else {
    iVar8 = (*(this->super_ChLoaderUVW).super_ChLoader._vptr_ChLoader[6])(this);
    pCVar12 = ChQuadrature::GetStaticTablesTetrahedron();
    if ((ulong)(long)iVar8 <=
        (ulong)(((long)(pCVar12->Weight).
                       super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_finish -
                (long)(pCVar12->Weight).
                      super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start) / 0x18)) {
      pCVar12 = ChQuadrature::GetStaticTablesTetrahedron();
      iVar8 = (*(this->super_ChLoaderUVW).super_ChLoader._vptr_ChLoader[6])(this);
      pvVar2 = (pCVar12->LrootsU).
               super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      pCVar12 = ChQuadrature::GetStaticTablesTetrahedron();
      iVar9 = (*(this->super_ChLoaderUVW).super_ChLoader._vptr_ChLoader[6])(this);
      pvVar3 = (pCVar12->LrootsV).
               super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      pCVar12 = ChQuadrature::GetStaticTablesTetrahedron();
      iVar10 = (*(this->super_ChLoaderUVW).super_ChLoader._vptr_ChLoader[6])(this);
      pvVar4 = (pCVar12->LrootsW).
               super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      pCVar12 = ChQuadrature::GetStaticTablesTetrahedron();
      iVar11 = (*(this->super_ChLoaderUVW).super_ChLoader._vptr_ChLoader[6])(this);
      detJ = (double)(this->super_ChLoaderUVW).super_ChLoader.Q.
                     super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows
      ;
      local_98 = (pCVar12->Weight).
                 super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start + iVar11;
      Eigen::Matrix<double,_-1,_1,_0,_-1,_1>::Matrix<long>(&mNF,(long *)&detJ);
      uVar19 = 0;
      while( true ) {
        lVar15 = *(long *)&pvVar2[(long)iVar8 + -1].
                           super__Vector_base<double,_std::allocator<double>_>._M_impl.
                           super__Vector_impl_data;
        uVar18 = (ulong)uVar19;
        if ((ulong)((long)pvVar2[(long)iVar8 + -1].
                          super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_finish - lVar15 >> 3) <= uVar18) break;
        (*(local_90->super_ChLoaderUVW).super_ChLoader._vptr_ChLoader[5])
                  (*(undefined8 *)(lVar15 + uVar18 * 8),
                   *(undefined8 *)
                    (*(long *)&pvVar3[(long)iVar9 + -1].
                               super__Vector_base<double,_std::allocator<double>_>._M_impl.
                               super__Vector_impl_data + uVar18 * 8),
                   *(undefined8 *)
                    (*(long *)&pvVar4[(long)iVar10 + -1].
                               super__Vector_base<double,_std::allocator<double>_>._M_impl.
                               super__Vector_impl_data + uVar18 * 8),local_90,&mF,local_88,local_80)
        ;
        peVar1 = (local_90->super_ChLoaderUVW).loadable.
                 super___shared_ptr<chrono::ChLoadableUVW,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
        (**(code **)((long)*peVar1 + 0x68))
                  (*(undefined8 *)
                    (*(long *)&pvVar2[(long)iVar8 + -1].
                               super__Vector_base<double,_std::allocator<double>_>._M_impl.
                               super__Vector_impl_data + uVar18 * 8),
                   *(undefined8 *)
                    (*(long *)&pvVar3[(long)iVar9 + -1].
                               super__Vector_base<double,_std::allocator<double>_>._M_impl.
                               super__Vector_impl_data + uVar18 * 8),
                   *(undefined8 *)
                    (*(long *)&pvVar4[(long)iVar10 + -1].
                               super__Vector_base<double,_std::allocator<double>_>._M_impl.
                               super__Vector_impl_data + uVar18 * 8),peVar1,
                   (DenseBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)&mNF,&detJ,&mF,local_88,
                   local_80);
        local_68 = detJ * *(double *)
                           (*(long *)&local_98[-1].
                                      super__Vector_base<double,_std::allocator<double>_>._M_impl.
                                      super__Vector_impl_data + uVar18 * 8) * 0.16666666666666666;
        Eigen::DenseBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::operator*=
                  ((DenseBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)&mNF,&local_68);
        Eigen::MatrixBase<Eigen::Matrix<double,-1,1,0,-1,1>>::operator+=
                  (local_58,(MatrixBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)&mNF);
        uVar19 = uVar19 + 1;
      }
LAB_00bbc3e8:
      Eigen::internal::handmade_aligned_free
                ((void *)CONCAT44(mNF.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
                                  .m_storage.m_data._4_4_,
                                  mNF.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
                                  .m_storage.m_data._0_4_));
      Eigen::internal::handmade_aligned_free
                (mF.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data)
      ;
      return;
    }
    __assertion = 
    "GetIntegrationPointsU() <= ChQuadrature::GetStaticTablesTetrahedron()->Weight.size()";
    uVar19 = 0x44;
  }
  __assert_fail(__assertion,
                "/workspace/llm4binary/github/license_all_cmakelists_25/cecilysunday[P]chrono/src/chrono/physics/ChLoaderUVW.h"
                ,uVar19,
                "virtual void chrono::ChLoaderUVWdistributed::ComputeQ(ChVectorDynamic<> *, ChVectorDynamic<> *)"
               );
}

Assistant:

virtual void ComputeQ(ChVectorDynamic<>* state_x,  ///< if != 0, update state (pos. part) to this, then evaluate Q
                          ChVectorDynamic<>* state_w   ///< if != 0, update state (speed part) to this, then evaluate Q
                          ) override {
        Q.setZero(loadable->LoadableGet_ndof_w());
        ChVectorDynamic<> mF(loadable->Get_field_ncoords());
        mF.setZero();

        if (loadable->IsTetrahedronIntegrationNeeded()) {
            // case of tetrahedron: use special 3d quadrature tables (given U,V,W orders, use the U only)
            assert(GetIntegrationPointsU() <= ChQuadrature::GetStaticTablesTetrahedron()->Weight.size());
            const std::vector<double>& Ulroots = ChQuadrature::GetStaticTablesTetrahedron()->LrootsU[GetIntegrationPointsU() - 1];
            const std::vector<double>& Vlroots = ChQuadrature::GetStaticTablesTetrahedron()->LrootsV[GetIntegrationPointsU() - 1];
            const std::vector<double>& Wlroots = ChQuadrature::GetStaticTablesTetrahedron()->LrootsW[GetIntegrationPointsU() - 1];
            const std::vector<double>& weight =  ChQuadrature::GetStaticTablesTetrahedron()->Weight[GetIntegrationPointsU() - 1];

            ChVectorDynamic<> mNF(Q.size());  // temporary value for loop

            // Gauss quadrature :  Q = sum (N'*F*detJ * wi * 1/6)   often detJ=6*tetrahedron volume
            for (unsigned int i = 0; i < Ulroots.size(); i++) {
                double detJ;
                // Compute F= F(u,v,w)
                this->ComputeF(Ulroots[i], Vlroots[i], Wlroots[i], mF, state_x, state_w);
                // Compute mNF= N(u,v,w)'*F
                loadable->ComputeNF(Ulroots[i], Vlroots[i], Wlroots[i], mNF, detJ, mF, state_x, state_w);
                // Compute Q+= mNF * detJ * wi * 1/6
                mNF *= (detJ * weight[i] * (1. / 6.));  // (the 1/6 coefficient is not in the table);
                Q += mNF;
            }
		}
		else if (loadable->IsTrianglePrismIntegrationNeeded()) {
			// Case of triangle prism: quadrature on u,v in [0..1] for the triangle, on w in [-1...+1] for thickness.
			assert(GetIntegrationPointsU() <= ChQuadrature::GetStaticTablesTriangle()->Weight.size());
            const std::vector<double>& Ulroots = ChQuadrature::GetStaticTablesTriangle()->LrootsU[GetIntegrationPointsU() - 1];
            const std::vector<double>& Vlroots = ChQuadrature::GetStaticTablesTriangle()->LrootsV[GetIntegrationPointsU() - 1];
            const std::vector<double>& weight = ChQuadrature::GetStaticTablesTriangle()->Weight[GetIntegrationPointsU() - 1];
			assert(GetIntegrationPointsW() <= ChQuadrature::GetStaticTables()->Lroots.size());
			const std::vector<double>& Wlroots = ChQuadrature::GetStaticTables()->Lroots[GetIntegrationPointsW() - 1];
            const std::vector<double>& Wweight = ChQuadrature::GetStaticTables()->Weight[GetIntegrationPointsW() - 1];

			ChVectorDynamic<> mNF(Q.size());  // temporary value for loop

			// Gauss quadrature :  Q = sum (N'*F*detJ * wi * wj *1/2)   often detJ= 2 * triangle area
			// This requires a single outer for loop over all triangle points, already queued in arrays Ulroots Vlroots, 
			// and an inner loop over thickness points Wlroots.
            for (unsigned int i = 0; i < Ulroots.size(); i++) {
				for (unsigned int iw = 0; iw < Wlroots.size(); iw++) {
					double detJ;
					// Compute F= F(u,v)
					this->ComputeF(Ulroots[i], Vlroots[i], Vlroots[iw], mF, state_x, state_w);
					// Compute mNF= N(u,v)'*F
					loadable->ComputeNF(Ulroots[i], Vlroots[i], Vlroots[iw], mNF, detJ, mF, state_x, state_w);
					// Compute Q+= mNF * detJ * wi *1/2
					mNF *= (detJ * weight[i] * Wweight[iw] * (1. / 2.));  // (the 1/2 coefficient is not in the triangle table);
					Q += mNF;
				}
            }
		}
		else {
            // Case of normal box isoparametric coords (default)
            assert(GetIntegrationPointsU() <= ChQuadrature::GetStaticTables()->Lroots.size());
            assert(GetIntegrationPointsV() <= ChQuadrature::GetStaticTables()->Lroots.size());
            assert(GetIntegrationPointsW() <= ChQuadrature::GetStaticTables()->Lroots.size());
            const std::vector<double>& Ulroots = ChQuadrature::GetStaticTables()->Lroots[GetIntegrationPointsU() - 1];
            const std::vector<double>& Uweight = ChQuadrature::GetStaticTables()->Weight[GetIntegrationPointsU() - 1];
            const std::vector<double>& Vlroots = ChQuadrature::GetStaticTables()->Lroots[GetIntegrationPointsV() - 1];
            const std::vector<double>& Vweight = ChQuadrature::GetStaticTables()->Weight[GetIntegrationPointsV() - 1];
            const std::vector<double>& Wlroots = ChQuadrature::GetStaticTables()->Lroots[GetIntegrationPointsW() - 1];
            const std::vector<double>& Wweight = ChQuadrature::GetStaticTables()->Weight[GetIntegrationPointsW() - 1];

            ChVectorDynamic<> mNF(Q.size());  // temporary value for loop

            // Gauss quadrature :  Q = sum (N'*F*detJ * wi*wj*wk)
            for (unsigned int iu = 0; iu < Ulroots.size(); iu++) {
                for (unsigned int iv = 0; iv < Vlroots.size(); iv++) {
                    for (unsigned int iw = 0; iw < Wlroots.size(); iw++) {
                        double detJ;
                        // Compute F= F(u,v,w)
                        this->ComputeF(Ulroots[iu], Vlroots[iv], Wlroots[iw], mF, state_x, state_w);
                        // Compute mNF= N(u,v,w)'*F
                        loadable->ComputeNF(Ulroots[iu], Vlroots[iv], Wlroots[iw], mNF, detJ, mF, state_x,
                                            state_w);
                        // Compute Q+= mNF * detJ * wi*wj*wk
                        mNF *= (detJ * Uweight[iu] * Vweight[iv] * Wweight[iw]);
                        Q += mNF;
                    }
                }
            }
        }  
    }